

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void optimize_cmf(png_bytep data,png_alloc_size_t data_size)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  
  if ((data_size < 0x4001) && (bVar4 = *data, (bVar4 & 0xf0) < 0x71 && (bVar4 & 0xf) == 8)) {
    bVar4 = bVar4 >> 4;
    uVar2 = (uint)bVar4;
    uVar3 = 0x80L << bVar4;
    if (data_size <= uVar3) {
      iVar1 = uVar2 * 0x1000 + 0x800;
      bVar4 = bVar4 << 4 | 8;
      do {
        uVar2 = uVar2 - 1;
        iVar1 = iVar1 + -0x1000;
        bVar4 = bVar4 - 0x10;
        if (uVar2 == 0) break;
        uVar3 = uVar3 >> 1 & 0x7fffffff;
      } while (data_size <= uVar3);
      *data = bVar4;
      uVar2 = (iVar1 + (data[1] & 0xffffffe0)) / 0x1f;
      bVar4 = (byte)(data[1] & 0xffffffe0);
      data[1] = (((char)uVar2 - (char)(uVar2 << 5)) + bVar4 | bVar4) ^ 0x1f;
    }
  }
  return;
}

Assistant:

static void
optimize_cmf(png_bytep data, png_alloc_size_t data_size)
{
   /* Optimize the CMF field in the zlib stream.  The resultant zlib stream is
    * still compliant to the stream specification.
    */
   if (data_size <= 16384) /* else windowBits must be 15 */
   {
      unsigned int z_cmf = data[0];  /* zlib compression method and flags */

      if ((z_cmf & 0x0f) == 8 && (z_cmf & 0xf0) <= 0x70)
      {
         unsigned int z_cinfo;
         unsigned int half_z_window_size;

         z_cinfo = z_cmf >> 4;
         half_z_window_size = 1U << (z_cinfo + 7);

         if (data_size <= half_z_window_size) /* else no change */
         {
            unsigned int tmp;

            do
            {
               half_z_window_size >>= 1;
               --z_cinfo;
            }
            while (z_cinfo > 0 && data_size <= half_z_window_size);

            z_cmf = (z_cmf & 0x0f) | (z_cinfo << 4);

            data[0] = (png_byte)z_cmf;
            tmp = data[1] & 0xe0;
            tmp += 0x1f - ((z_cmf << 8) + tmp) % 0x1f;
            data[1] = (png_byte)tmp;
         }
      }
   }
}